

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O2

void __thiscall
icu_63::LocaleDisplayNamesImpl::LocaleDisplayNamesImpl
          (LocaleDisplayNamesImpl *this,Locale *locale,UDisplayContext *contexts,int32_t length)

{
  uint uVar1;
  UDialectHandling *pUVar2;
  
  (this->super_LocaleDisplayNames).super_UObject._vptr_UObject =
       (_func_int **)&PTR__LocaleDisplayNamesImpl_003cf788;
  Locale::Locale(&this->locale);
  this->dialectHandling = ULDN_STANDARD_NAMES;
  ICUDataTable::ICUDataTable(&this->langData,"icudt63l-lang",locale);
  ICUDataTable::ICUDataTable(&this->regionData,"icudt63l-region",locale);
  SimpleFormatter::SimpleFormatter(&this->separatorFormat);
  SimpleFormatter::SimpleFormatter(&this->format);
  SimpleFormatter::SimpleFormatter(&this->keyTypeFormat);
  this->capitalizationContext = UDISPCTX_CAPITALIZATION_NONE;
  this->capitalizationBrkIter = (BreakIterator *)0x0;
  (this->formatOpenParen).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003daac8;
  (this->formatOpenParen).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->formatReplaceOpenParen).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003daac8;
  (this->formatReplaceOpenParen).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->formatCloseParen).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003daac8;
  (this->formatCloseParen).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->formatReplaceCloseParen).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003daac8;
  (this->formatReplaceCloseParen).fUnion.fStackFields.fLengthAndFlags = 2;
  this->nameLength = UDISPCTX_LENGTH_FULL;
  for (; 0 < length; length = length + -1) {
    uVar1 = *contexts >> 8;
    pUVar2 = &this->dialectHandling;
    if (((uVar1 == 0) || (pUVar2 = &this->capitalizationContext, uVar1 == 1)) ||
       (pUVar2 = &this->nameLength, uVar1 == 2)) {
      *pUVar2 = *contexts;
    }
    contexts = contexts + 1;
  }
  initialize(this);
  return;
}

Assistant:

LocaleDisplayNamesImpl::LocaleDisplayNamesImpl(const Locale& locale,
                                               UDisplayContext *contexts, int32_t length)
    : dialectHandling(ULDN_STANDARD_NAMES)
    , langData(U_ICUDATA_LANG, locale)
    , regionData(U_ICUDATA_REGION, locale)
    , capitalizationContext(UDISPCTX_CAPITALIZATION_NONE)
    , capitalizationBrkIter(NULL)
    , nameLength(UDISPCTX_LENGTH_FULL)
{
    while (length-- > 0) {
        UDisplayContext value = *contexts++;
        UDisplayContextType selector = (UDisplayContextType)((uint32_t)value >> 8);
        switch (selector) {
            case UDISPCTX_TYPE_DIALECT_HANDLING:
                dialectHandling = (UDialectHandling)value;
                break;
            case UDISPCTX_TYPE_CAPITALIZATION:
                capitalizationContext = value;
                break;
            case UDISPCTX_TYPE_DISPLAY_LENGTH:
                nameLength = value;
                break;
            default:
                break;
        }
    }
    initialize();
}